

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExceptionHandler.h
# Opt level: O2

void __thiscall ExceptionHandler<Client>::handle(ExceptionHandler<Client> *this,Client *client)

{
  (**this->next_handler->_vptr_IHandler)();
  return;
}

Assistant:

void ExceptionHandler<T>::ExceptionHandler::handle(T&& client) {
    try {
        next_handler.handle(std::move(client));
    } catch(std::exception& ex) {
        stream << "Exception: " << ex.what() << std::endl;
    }
}